

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void build_tree(deflate_state *s,tree_desc *desc)

{
  uint16_t *bl_count;
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ct_data *tree;
  ct_data *pcVar5;
  static_tree_desc *psVar6;
  ct_data *pcVar7;
  int *piVar8;
  int iVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint16_t *puVar22;
  unsigned_long uVar23;
  bool bVar24;
  
  tree = desc->dyn_tree;
  pcVar5 = desc->stat_desc->static_tree;
  uVar20 = desc->stat_desc->elems;
  s->heap_len = 0;
  s->heap_max = 0x23d;
  uVar10 = 0;
  uVar13 = 0;
  if (0 < (int)uVar20) {
    uVar13 = (ulong)uVar20;
  }
  uVar16 = 0xffffffffffffffff;
  for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    if (tree[uVar10].fc.freq == 0) {
      tree[uVar10].dl.dad = 0;
    }
    else {
      iVar14 = s->heap_len;
      s->heap_len = iVar14 + 1;
      s->heap[(long)iVar14 + 1] = (int)uVar10;
      s->depth[uVar10] = '\0';
      uVar16 = uVar10 & 0xffffffff;
    }
  }
  while( true ) {
    uVar21 = s->heap_len;
    iVar14 = (int)uVar16;
    if (1 < (long)(int)uVar21) break;
    uVar12 = iVar14 + 1;
    uVar16 = uVar16 & 0xffffffff;
    if (iVar14 < 2) {
      uVar16 = (ulong)uVar12;
    }
    else {
      uVar12 = 0;
    }
    s->heap_len = uVar21 + 1;
    s->heap[(long)(int)uVar21 + 1] = uVar12;
    tree[(int)uVar12].fc.freq = 1;
    s->depth[(int)uVar12] = '\0';
    s->opt_len = s->opt_len - 1;
    if (pcVar5 != (ct_data *)0x0) {
      s->static_len = s->static_len - (ulong)pcVar5[(int)uVar12].dl.dad;
    }
  }
  desc->max_code = iVar14;
  for (uVar21 = uVar21 >> 1; 0 < (int)uVar21; uVar21 = uVar21 - 1) {
    pqdownheap(s,tree,uVar21);
  }
  iVar9 = s->heap_len;
  lVar17 = (long)(int)uVar20;
  do {
    iVar3 = s->heap[1];
    s->heap_len = iVar9 + -1;
    s->heap[1] = s->heap[iVar9];
    pqdownheap(s,tree,1);
    iVar9 = s->heap[1];
    iVar15 = s->heap_max;
    s->heap_max = iVar15 + -1;
    s->heap[(long)iVar15 + -1] = iVar3;
    iVar15 = s->heap_max;
    s->heap_max = iVar15 + -1;
    s->heap[(long)iVar15 + -1] = iVar9;
    tree[lVar17].fc.freq = tree[iVar9].fc.freq + tree[iVar3].fc.freq;
    bVar11 = s->depth[iVar9];
    if (s->depth[iVar9] < s->depth[iVar3]) {
      bVar11 = s->depth[iVar3];
    }
    s->depth[lVar17] = bVar11 + 1;
    tree[iVar9].dl.dad = (uint16_t)lVar17;
    tree[iVar3].dl.dad = (uint16_t)lVar17;
    s->heap[1] = (int)lVar17;
    pqdownheap(s,tree,1);
    iVar9 = s->heap_len;
    lVar17 = lVar17 + 1;
  } while (1 < iVar9);
  iVar9 = s->heap[1];
  iVar3 = s->heap_max;
  s->heap_max = iVar3 + -1;
  s->heap[(long)iVar3 + -1] = iVar9;
  pcVar5 = desc->dyn_tree;
  iVar9 = desc->max_code;
  psVar6 = desc->stat_desc;
  pcVar7 = psVar6->static_tree;
  piVar8 = psVar6->extra_bits;
  iVar3 = psVar6->extra_base;
  uVar20 = psVar6->max_length;
  bl_count = s->bl_count;
  for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
    bl_count[lVar17] = 0;
  }
  pcVar5[s->heap[s->heap_max]].dl.dad = 0;
  iVar15 = s->heap_max;
  iVar18 = 0;
  for (lVar17 = (long)iVar15; iVar15 = iVar15 + 1, lVar17 < 0x23c; lVar17 = lVar17 + 1) {
    iVar4 = s->heap[lVar17 + 1];
    uVar1 = pcVar5[pcVar5[iVar4].dl.dad].dl.dad;
    uVar21 = uVar20;
    if (uVar1 < uVar20) {
      uVar21 = uVar1 + 1;
    }
    pcVar5[iVar4].dl.dad = (uint16_t)uVar21;
    if (iVar4 <= iVar9) {
      bl_count[uVar21] = bl_count[uVar21] + 1;
      iVar19 = 0;
      if (iVar3 <= iVar4) {
        iVar19 = piVar8[iVar4 - iVar3];
      }
      uVar2 = pcVar5[iVar4].fc.freq;
      s->opt_len = s->opt_len + (ulong)(uVar21 + iVar19) * (ulong)uVar2;
      if (pcVar7 != (ct_data *)0x0) {
        s->static_len = s->static_len + (ulong)(iVar19 + (uint)pcVar7[iVar4].dl.dad) * (ulong)uVar2;
      }
    }
    iVar18 = iVar18 + (uint)(uVar20 <= uVar1);
  }
  if (iVar18 != 0) {
    uVar21 = uVar20 + 1;
    do {
      do {
        uVar12 = uVar21 - 2;
        uVar21 = uVar21 - 1;
      } while (bl_count[uVar12] == 0);
      bl_count[uVar12] = bl_count[uVar12] - 1;
      bl_count[uVar21] = bl_count[uVar21] + 2;
      bl_count[uVar20] = bl_count[uVar20] - 1;
      bVar24 = 2 < iVar18;
      uVar10 = (ulong)uVar20;
      uVar21 = uVar20 + 1;
      iVar18 = iVar18 + -2;
    } while (bVar24);
    while (uVar13 = uVar10, uVar13 != 0) {
      uVar20 = (uint)bl_count[uVar13];
      while (bVar24 = uVar20 != 0, uVar20 = uVar20 - 1, uVar10 = uVar13 - 1, bVar24) {
        puVar22 = (uint16_t *)(s->heap + (long)iVar15 + -1);
        do {
          iVar3 = *(int *)puVar22;
          iVar15 = iVar15 + -1;
          puVar22 = puVar22 + -2;
        } while (iVar9 < iVar3);
        if (uVar13 != pcVar5[iVar3].dl.dad) {
          uVar23 = (ulong)((uint)pcVar5[iVar3].fc.freq * (int)uVar13) + s->opt_len;
          s->opt_len = uVar23;
          s->opt_len = uVar23 - (ulong)pcVar5[iVar3].fc.freq * (ulong)pcVar5[iVar3].dl.dad;
          pcVar5[iVar3].dl.dad = (uint16_t)uVar13;
        }
      }
    }
  }
  gen_codes(tree,iVar14,bl_count);
  return;
}

Assistant:

static void build_tree(deflate_state *s, tree_desc *desc) {
    /* desc: the tree descriptor */
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    s->heap_len = 0;
    s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--;
        if (stree)
            s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--)
        pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (unsigned char)((s->depth[n] >= s->depth[m] ?
                                          s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (uint16_t)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr, "\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);
    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes((ct_data *)tree, max_code, s->bl_count);
}